

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeBatchResultToXml.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  exception *e;
  undefined1 local_60 [8];
  CommandLine cmdLine;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  cmdLine._64_8_ = argv;
  CommandLine::CommandLine((CommandLine *)local_60);
  bVar1 = parseCommandLine((CommandLine *)local_60,argc,(char **)cmdLine._64_8_);
  if (bVar1) {
    if (cmdLine.outputPath.field_2._8_4_ == 1) {
      pcVar2 = (char *)std::__cxx11::string::c_str();
      pcVar3 = (char *)std::__cxx11::string::c_str();
      batchResultToSingleXmlFile(pcVar2,pcVar3);
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::c_str();
      pcVar3 = (char *)std::__cxx11::string::c_str();
      batchResultToSeparateXmlFiles(pcVar2,pcVar3);
    }
    bVar1 = false;
  }
  else {
    argv_local._4_4_ = -1;
    bVar1 = true;
  }
  CommandLine::~CommandLine((CommandLine *)local_60);
  if (!bVar1) {
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int main (int argc, const char* const* argv)
{
	try
	{
		CommandLine cmdLine;
		if (!parseCommandLine(cmdLine, argc, argv))
			return -1;

		if (cmdLine.outputMode == OUTPUTMODE_SINGLE)
			batchResultToSingleXmlFile(cmdLine.batchResultFile.c_str(), cmdLine.outputPath.c_str());
		else
			batchResultToSeparateXmlFiles(cmdLine.batchResultFile.c_str(), cmdLine.outputPath.c_str());
	}
	catch (const std::exception& e)
	{
		printf("%s\n", e.what());
		return -1;
	}

	return 0;
}